

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS
ref_oct_set_node_at_node
          (REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_INT insert_node,REF_DBL *xyz)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL box [6];
  int local_f0;
  REF_INT child_index;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL tol;
  REF_DBL dist;
  REF_DBL my_xyz [3];
  double dStack_b8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL h;
  REF_INT corner;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL overlap;
  REF_DBL expand;
  REF_DBL point [6];
  REF_DBL fuzz [6];
  REF_DBL *xyz_local;
  REF_INT insert_node_local;
  REF_DBL *bbox_local;
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  _ref_private_macro_code_rss = 0x3ff028f5c28f5c29;
  expand = *xyz;
  point[0] = *xyz;
  point[1] = xyz[1];
  point[2] = xyz[1];
  point[3] = xyz[2];
  point[4] = xyz[2];
  corner = ref_oct_bbox_scale(bbox,1.01,point + 5);
  if (corner == 0) {
    h._4_4_ = ref_oct_bbox_overlap(&expand,point + 5,&ref_private_macro_code_rss_1);
    if (h._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_oct_local._4_4_ = 0;
      }
      else {
        if (ref_oct->children[node << 3] == -1) {
          my_xyz[2]._4_4_ = ref_oct_bbox_diag(bbox,&stack0xffffffffffffff48);
          if (my_xyz[2]._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x1b3,"ref_oct_set_node_at_node",(ulong)my_xyz[2]._4_4_,"diag");
            return my_xyz[2]._4_4_;
          }
          my_xyz[2]._4_4_ = 0;
          for (h._0_4_ = 0; h._0_4_ < 0x1b; h._0_4_ = h._0_4_ + 1) {
            uVar1 = ref_oct_bbox_corner(bbox,h._0_4_,&dist);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1b6,"ref_oct_set_node_at_node",(ulong)uVar1,"corner xyz");
              return uVar1;
            }
            dVar2 = pow(*xyz - dist,2.0);
            dVar3 = pow(xyz[1] - my_xyz[0],2.0);
            dVar4 = pow(xyz[2] - my_xyz[1],2.0);
            dVar2 = sqrt(dVar2 + dVar3 + dVar4);
            if (dVar2 < dStack_b8 * 0.1) {
              ref_oct->nodes[h._0_4_ + node * 0x1b] = insert_node;
            }
          }
        }
        else {
          h._4_4_ = 0;
          for (local_f0 = 0; local_f0 < 8; local_f0 = local_f0 + 1) {
            uVar1 = ref_oct_child_bbox(bbox,local_f0,(REF_DBL *)&ref_private_macro_code_rss_5);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1c1,"ref_oct_set_node_at_node",(ulong)uVar1,"bbox");
              return uVar1;
            }
            if (node == ref_oct->children[local_f0 + node * 8]) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1c2,"ref_oct_set_node_at_node","same");
              return 1;
            }
            uVar1 = ref_oct_set_node_at_node
                              (ref_oct,ref_oct->children[local_f0 + node * 8],
                               (REF_DBL *)&ref_private_macro_code_rss_5,insert_node,xyz);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x1c6,"ref_oct_set_node_at_node",(ulong)uVar1,"recurse");
              return uVar1;
            }
          }
        }
        ref_oct_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x1ad,
             "ref_oct_set_node_at_node",(ulong)h._4_4_,"overlap");
      ref_oct_local._4_4_ = h._4_4_;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x1ac,
           "ref_oct_set_node_at_node",(ulong)(uint)corner,"scale bbox");
    ref_oct_local._4_4_ = corner;
  }
  return ref_oct_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_set_node_at_node(REF_OCT ref_oct,
                                                   REF_INT node, REF_DBL *bbox,
                                                   REF_INT insert_node,
                                                   REF_DBL *xyz) {
  REF_DBL fuzz[6], point[6], expand = 1.01;
  REF_BOOL overlap;

  point[0] = xyz[0];
  point[1] = xyz[0];
  point[2] = xyz[1];
  point[3] = xyz[1];
  point[4] = xyz[2];
  point[5] = xyz[2];
  RSS(ref_oct_bbox_scale(bbox, expand, fuzz), "scale bbox");
  RSS(ref_oct_bbox_overlap(point, fuzz, &overlap), "overlap");
  if (!overlap) return REF_SUCCESS;

  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    REF_DBL h;
    RSS(ref_oct_bbox_diag(bbox, &h), "diag");
    for (corner = 0; corner < 27; corner++) {
      REF_DBL my_xyz[3], dist, tol = 0.1;
      RSS(ref_oct_bbox_corner(bbox, corner, my_xyz), "corner xyz");
      dist = sqrt(pow(xyz[0] - my_xyz[0], 2) + pow(xyz[1] - my_xyz[1], 2) +
                  pow(xyz[2] - my_xyz[2], 2));
      if (dist < tol * h) {
        ref_oct_c2n(ref_oct, corner, node) = insert_node;
      }
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RUS(node, ref_oct_child(ref_oct, child_index, node), "same");
      RSS(ref_oct_set_node_at_node(ref_oct,
                                   ref_oct_child(ref_oct, child_index, node),
                                   box, insert_node, xyz),
          "recurse");
    }
  }
  return REF_SUCCESS;
}